

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxmtoau.c
# Opt level: O2

int main(int argc,char **argv)

{
  uint __line;
  uint8_t uVar1;
  int iVar2;
  FILE *__stream;
  size_t sVar3;
  char *pcVar4;
  size_t k;
  long lVar5;
  xm_context_t *ctx;
  size_t datalen;
  rusage r;
  float local_4038 [4098];
  
  if (argc != 2) {
    return 1;
  }
  __stream = fopen(argv[1],"rb");
  if (__stream == (FILE *)0x0) {
    pcVar4 = "fp";
    __line = 0x2d;
  }
  else {
    sVar3 = fread(&datalen,8,1,__stream);
    if (sVar3 == 0) {
      pcVar4 = "fread(&datalen, sizeof(size_t), 1, fp)";
      __line = 0x2e;
    }
    else {
      rewind(__stream);
      iVar2 = fileno(__stream);
      pcVar4 = (char *)mmap((void *)0x0,datalen,3,2,iVar2,0);
      if (pcVar4 == (char *)0xffffffffffffffff) {
        pcVar4 = "data != MAP_FAILED";
        __line = 0x31;
      }
      else {
        xm_create_context_from_libxmize(&ctx,pcVar4,48000);
        puts_uint32_be(0x2e736e64);
        puts_uint32_be(0x1c);
        puts_uint32_be(0xffffffff);
        puts_uint32_be(6);
        puts_uint32_be(48000);
        puts_uint32_be(2);
        puts_uint32_be(0);
        while (uVar1 = xm_get_loop_count(ctx), uVar1 == '\0') {
          xm_generate_samples(ctx,local_4038,0x800);
          for (lVar5 = 0; lVar5 != 0x1000; lVar5 = lVar5 + 1) {
            puts_uint32_be((uint32_t)local_4038[lVar5]);
          }
        }
        iVar2 = getrusage(RUSAGE_SELF,(rusage *)&r);
        if (iVar2 == 0) {
          fprintf(_stderr,"%s: libxmized length %lu, ru_maxrss %ld\n",*argv,datalen,
                  r.field_2.ru_maxrss);
          munmap(pcVar4,datalen);
          fclose(__stream);
          return 0;
        }
        pcVar4 = "!getrusage(RUSAGE_SELF, &r)";
        __line = 0x4a;
      }
    }
  }
  __assert_fail(pcVar4,
                "/workspace/llm4binary/github/license_c_cmakelists/Artefact2[P]libxm/examples/libxmtoau.c"
                ,__line,"int main(int, char **)");
}

Assistant:

int main(int argc, char** argv) {
	float buffer[buffer_size];
	xm_context_t* ctx;
	void* data;
	size_t datalen;
	FILE* fp;

	if(argc != 2) return 1;

	fp = fopen(argv[1], "rb");
	assert(fp);
	assert(fread(&datalen, sizeof(size_t), 1, fp));
	rewind(fp);
	data = mmap(0, datalen, PROT_READ|PROT_WRITE, MAP_PRIVATE, fileno(fp), 0);
	assert(data != MAP_FAILED);
	xm_create_context_from_libxmize(&ctx, data, rate);

	puts_uint32_be(0x2E736E64); /* .snd magic number */
	puts_uint32_be(28); /* Header size */
	puts_uint32_be((uint32_t)(-1)); /* Data size, unknown */
	puts_uint32_be(6); /* Encoding: 32-bit IEEE floating point */
	puts_uint32_be(rate); /* Sample rate */
	puts_uint32_be(channels); /* Number of interleaved channels */
	puts_uint32_be(0); /* Optional text information */

	while(!xm_get_loop_count(ctx)) {
		xm_generate_samples(ctx, buffer, sizeof(buffer) / (channels * sizeof(float)));
		for(size_t k = 0; k < buffer_size; ++k) {
			union {
				float f;
				uint32_t i;
			} u;

			u.f = buffer[k];
			puts_uint32_be(u.i);
		}
	}

	struct rusage r;
	assert(!getrusage(RUSAGE_SELF, &r));
	fprintf(stderr, "%s: libxmized length %lu, ru_maxrss %ld\n", argv[0], datalen, r.ru_maxrss);

	munmap(data, datalen);
	fclose(fp);
	return 0;
}